

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbistbl.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::RBBISymbolTable::parseReference
          (UnicodeString *__return_storage_ptr__,RBBISymbolTable *this,UnicodeString *text,
          ParsePosition *pos,int32_t limit)

{
  short sVar1;
  uint uVar2;
  UBool UVar3;
  uint uVar4;
  char16_t *pcVar5;
  uint uVar6;
  uint c;
  bool bVar7;
  
  uVar2 = pos->index;
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e7ab8;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  uVar6 = uVar2;
  do {
    if (limit <= (int)uVar6) break;
    sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar4 = (text->fUnion).fFields.fLength;
    }
    else {
      uVar4 = (int)sVar1 >> 5;
    }
    c = 0xffff;
    if (uVar6 < uVar4) {
      pcVar5 = (char16_t *)((long)&text->fUnion + 2);
      if (((int)sVar1 & 2U) == 0) {
        pcVar5 = (text->fUnion).fFields.fArray;
      }
      c = (uint)(ushort)pcVar5[(int)uVar6];
    }
    if ((uVar6 == uVar2) && (UVar3 = u_isIDStart_63(c), UVar3 == '\0')) {
      bVar7 = false;
    }
    else {
      UVar3 = u_isIDPart_63(c);
      bVar7 = UVar3 != '\0';
      uVar6 = uVar6 + bVar7;
    }
  } while (bVar7);
  if (uVar6 != uVar2) {
    pos->index = uVar6;
    (*(text->super_Replaceable).super_UObject._vptr_UObject[3])
              (text,(ulong)uVar2,(ulong)uVar6,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString   RBBISymbolTable::parseReference(const UnicodeString& text,
                                                ParsePosition& pos, int32_t limit) const
{
    int32_t start = pos.getIndex();
    int32_t i = start;
    UnicodeString result;
    while (i < limit) {
        UChar c = text.charAt(i);
        if ((i==start && !u_isIDStart(c)) || !u_isIDPart(c)) {
            break;
        }
        ++i;
    }
    if (i == start) { // No valid name chars
        return result; // Indicate failure with empty string
    }
    pos.setIndex(i);
    text.extractBetween(start, i, result);
    return result;
}